

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleCacheMode(cmSetPropertyCommand *this)

{
  string *psVar1;
  _Rb_tree_node_base *key;
  bool bVar2;
  ostream *poVar3;
  cmake *pcVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  ostringstream e;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  psVar1 = &this->PropertyName;
  bVar2 = std::operator==(psVar1,"ADVANCED");
  if (bVar2) {
    if (this->Remove == false) {
      psVar1 = &this->PropertyValue;
      bVar2 = cmSystemTools::IsOn(psVar1);
      if ((!bVar2) && (bVar2 = cmSystemTools::IsOff(psVar1), !bVar2)) {
        std::__cxx11::ostringstream::ostringstream(local_198);
        poVar3 = std::operator<<((ostream *)local_198,"given non-boolean value \"");
        poVar3 = std::operator<<(poVar3,(string *)psVar1);
        std::operator<<(poVar3,"\" for CACHE property \"ADVANCED\".  ");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
        goto LAB_002019a2;
      }
    }
  }
  else {
    bVar2 = std::operator==(psVar1,"TYPE");
    if (bVar2) {
      bVar2 = cmState::IsCacheEntryType(&this->PropertyValue);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_198);
        poVar3 = std::operator<<((ostream *)local_198,"given invalid CACHE entry TYPE \"");
        poVar3 = std::operator<<(poVar3,(string *)&this->PropertyValue);
        std::operator<<(poVar3,"\"");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
        goto LAB_002019a2;
      }
    }
    else {
      bVar2 = std::operator!=(psVar1,"HELPSTRING");
      if (((bVar2) && (bVar2 = std::operator!=(psVar1,"STRINGS"), bVar2)) &&
         (bVar2 = std::operator!=(psVar1,"VALUE"), bVar2)) {
        std::__cxx11::ostringstream::ostringstream(local_198);
        poVar3 = std::operator<<((ostream *)local_198,"given invalid CACHE property ");
        poVar3 = std::operator<<(poVar3,(string *)psVar1);
        poVar3 = std::operator<<(poVar3,".  ");
        poVar3 = std::operator<<(poVar3,"Settable CACHE properties are: ");
        std::operator<<(poVar3,"ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
        goto LAB_002019a2;
      }
    }
  }
  p_Var6 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 == &(this->Names)._M_t._M_impl.super__Rb_tree_header) {
      return true;
    }
    key = p_Var6 + 1;
    pcVar4 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    pcVar5 = cmState::GetCacheEntryValue
                       ((pcVar4->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)key);
    if (pcVar5 == (char *)0x0) break;
    HandleCacheEntry(this,(string *)key);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"could not find CACHE variable ");
  poVar3 = std::operator<<(poVar3,(string *)key);
  std::operator<<(poVar3,".  Perhaps it has not yet been created.");
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
LAB_002019a2:
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheMode()
{
  if (this->PropertyName == "ADVANCED") {
    if (!this->Remove && !cmSystemTools::IsOn(this->PropertyValue) &&
        !cmSystemTools::IsOff(this->PropertyValue)) {
      std::ostringstream e;
      e << "given non-boolean value \"" << this->PropertyValue
        << R"(" for CACHE property "ADVANCED".  )";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName == "TYPE") {
    if (!cmState::IsCacheEntryType(this->PropertyValue)) {
      std::ostringstream e;
      e << "given invalid CACHE entry TYPE \"" << this->PropertyValue << "\"";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName != "HELPSTRING" &&
             this->PropertyName != "STRINGS" &&
             this->PropertyName != "VALUE") {
    std::ostringstream e;
    e << "given invalid CACHE property " << this->PropertyName << ".  "
      << "Settable CACHE properties are: "
      << "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.";
    this->SetError(e.str());
    return false;
  }

  for (std::string const& name : this->Names) {
    // Get the source file.
    cmMakefile* mf = this->GetMakefile();
    cmake* cm = mf->GetCMakeInstance();
    const char* existingValue = cm->GetState()->GetCacheEntryValue(name);
    if (existingValue) {
      if (!this->HandleCacheEntry(name)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "could not find CACHE variable " << name
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}